

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool trans_UMAAL(DisasContext_conflict1 *s,arg_UMAAL *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  int iVar1;
  TCGv_i32 rl;
  TCGv_i32 rh;
  TCGv_i32 bh;
  TCGv_i32 pTVar2;
  TCGv_i32 zero;
  TCGv_i32 t2;
  TCGv_i32 t1;
  TCGv_i32 t0;
  TCGContext_conflict1 *tcg_ctx;
  arg_UMAAL *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if (s->thumb == 0) {
    iVar1 = arm_dc_feature(s,3);
  }
  else {
    iVar1 = arm_dc_feature(s,0x22);
  }
  if (iVar1 != 0) {
    rl = load_reg(s,a->rm);
    rh = load_reg(s,a->rn);
    tcg_gen_mulu2_i32_aarch64(tcg_ctx_00,rl,rh,rl,rh);
    bh = tcg_const_i32_aarch64(tcg_ctx_00,0);
    pTVar2 = load_reg(s,a->ra);
    tcg_gen_add2_i32_aarch64(tcg_ctx_00,rl,rh,rl,rh,pTVar2,bh);
    tcg_temp_free_i32(tcg_ctx_00,pTVar2);
    pTVar2 = load_reg(s,a->rd);
    tcg_gen_add2_i32_aarch64(tcg_ctx_00,rl,rh,rl,rh,pTVar2,bh);
    tcg_temp_free_i32(tcg_ctx_00,pTVar2);
    tcg_temp_free_i32(tcg_ctx_00,bh);
    store_reg(s,a->ra,rl);
    store_reg(s,a->rd,rh);
  }
  return iVar1 != 0;
}

Assistant:

static bool trans_UMAAL(DisasContext *s, arg_UMAAL *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 t0, t1, t2, zero;

    if (s->thumb
        ? !arm_dc_feature(s, ARM_FEATURE_THUMB_DSP)
        : !ENABLE_ARCH_6) {
        return false;
    }

    t0 = load_reg(s, a->rm);
    t1 = load_reg(s, a->rn);
    tcg_gen_mulu2_i32(tcg_ctx, t0, t1, t0, t1);
    zero = tcg_const_i32(tcg_ctx, 0);
    t2 = load_reg(s, a->ra);
    tcg_gen_add2_i32(tcg_ctx, t0, t1, t0, t1, t2, zero);
    tcg_temp_free_i32(tcg_ctx, t2);
    t2 = load_reg(s, a->rd);
    tcg_gen_add2_i32(tcg_ctx, t0, t1, t0, t1, t2, zero);
    tcg_temp_free_i32(tcg_ctx, t2);
    tcg_temp_free_i32(tcg_ctx, zero);
    store_reg(s, a->ra, t0);
    store_reg(s, a->rd, t1);
    return true;
}